

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O1

void __thiscall
olc::Renderable::Create(Renderable *this,uint32_t width,uint32_t height,bool filter,bool clamp)

{
  _Head_base<0UL,_olc::Sprite_*,_false> spr;
  Decal *pDVar1;
  Sprite *this_00;
  Decal *this_01;
  pointer __p;
  __uniq_ptr_impl<olc::Sprite,_std::default_delete<olc::Sprite>_> local_38;
  
  this_00 = (Sprite *)operator_new(0x28);
  olc::Sprite::Sprite(this_00,width,height);
  local_38._M_t.super__Tuple_impl<0UL,_olc::Sprite_*,_std::default_delete<olc::Sprite>_>.
  super__Head_base<0UL,_olc::Sprite_*,_false>._M_head_impl =
       (tuple<olc::Sprite_*,_std::default_delete<olc::Sprite>_>)
       (_Tuple_impl<0UL,_olc::Sprite_*,_std::default_delete<olc::Sprite>_>)0x0;
  std::__uniq_ptr_impl<olc::Sprite,_std::default_delete<olc::Sprite>_>::reset
            ((__uniq_ptr_impl<olc::Sprite,_std::default_delete<olc::Sprite>_> *)this,this_00);
  std::unique_ptr<olc::Sprite,_std::default_delete<olc::Sprite>_>::~unique_ptr
            ((unique_ptr<olc::Sprite,_std::default_delete<olc::Sprite>_> *)&local_38);
  spr._M_head_impl =
       (this->pSprite)._M_t.super___uniq_ptr_impl<olc::Sprite,_std::default_delete<olc::Sprite>_>.
       _M_t.super__Tuple_impl<0UL,_olc::Sprite_*,_std::default_delete<olc::Sprite>_>.
       super__Head_base<0UL,_olc::Sprite_*,_false>._M_head_impl;
  this_01 = (Decal *)operator_new(0x20);
  olc::Decal::Decal(this_01,spr._M_head_impl,filter,clamp);
  pDVar1 = (this->pDecal)._M_t.super___uniq_ptr_impl<olc::Decal,_std::default_delete<olc::Decal>_>.
           _M_t.super__Tuple_impl<0UL,_olc::Decal_*,_std::default_delete<olc::Decal>_>.
           super__Head_base<0UL,_olc::Decal_*,_false>._M_head_impl;
  (this->pDecal)._M_t.super___uniq_ptr_impl<olc::Decal,_std::default_delete<olc::Decal>_>._M_t.
  super__Tuple_impl<0UL,_olc::Decal_*,_std::default_delete<olc::Decal>_>.
  super__Head_base<0UL,_olc::Decal_*,_false>._M_head_impl = this_01;
  if (pDVar1 != (Decal *)0x0) {
    (*pDVar1->_vptr_Decal[1])();
  }
  return;
}

Assistant:

void Renderable::Create(uint32_t width, uint32_t height, bool filter, bool clamp)
	{
		pSprite = std::make_unique<olc::Sprite>(width, height);
		pDecal = std::make_unique<olc::Decal>(pSprite.get(), filter, clamp);
	}